

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

Gia_Man_t *
Gia_ManIsoReduce2(Gia_Man_t *pGia,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                 int fBetterQual,int fDualOut,int fVerbose,int fVeryVerbose)

{
  Vec_Ptr_t **p;
  uint uVar1;
  uint uVar2;
  int nPos;
  abctime aVar3;
  abctime aVar4;
  int *pPos;
  Vec_Ptr_t *pVVar5;
  abctime clk;
  int nUsedPos;
  int nClasses;
  Vec_Int_t *vRemains;
  Vec_Wec_t *vEquivs2;
  Vec_Wec_t *vEquivs;
  Gia_Man_t *pPart;
  int local_30;
  int fDualOut_local;
  int fBetterQual_local;
  int fEstimate_local;
  Vec_Ptr_t **pvPiPerms_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Gia_Man_t *pGia_local;
  
  pPart._4_4_ = fDualOut;
  local_30 = fBetterQual;
  fDualOut_local = fEstimate;
  _fBetterQual_local = pvPiPerms;
  pvPiPerms_local = pvPosEquivs;
  pvPosEquivs_local = (Vec_Ptr_t **)pGia;
  aVar3 = Abc_Clock();
  vEquivs2 = Gia_Iso2ManPerform((Gia_Man_t *)pvPosEquivs_local,fVeryVerbose);
  clk._4_4_ = Vec_WecCountNonTrivial(vEquivs2,(int *)&clk);
  uVar1 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
  uVar2 = Vec_WecSize(vEquivs2);
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)uVar1,(ulong)uVar2,(ulong)(uint)clk,(ulong)clk._4_4_);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  if (fDualOut_local == 0) {
    if (local_30 == 0) {
      vRemains = (Vec_Int_t *)
                 Gia_Iso2ManCheckIsoClassesSkip((Gia_Man_t *)pvPosEquivs_local,vEquivs2);
    }
    else {
      vRemains = (Vec_Int_t *)Gia_Iso2ManCheckIsoClasses((Gia_Man_t *)pvPosEquivs_local,vEquivs2);
    }
    Vec_WecFree(vEquivs2);
    vEquivs2 = (Vec_Wec_t *)vRemains;
    Vec_WecSortByFirstInt((Vec_Wec_t *)vRemains,0);
    _nUsedPos = Vec_WecCollectFirsts(vEquivs2);
    p = pvPosEquivs_local;
    pPos = Vec_IntArray(_nUsedPos);
    nPos = Vec_IntSize(_nUsedPos);
    vEquivs = (Vec_Wec_t *)Gia_ManDupCones((Gia_Man_t *)p,pPos,nPos,0);
    Vec_IntFree(_nUsedPos);
    clk._4_4_ = Vec_WecCountNonTrivial(vEquivs2,(int *)&clk);
    uVar1 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
    uVar2 = Vec_WecSize(vEquivs2);
    printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
           ,(ulong)uVar1,(ulong)uVar2,(ulong)(uint)clk,(ulong)clk._4_4_);
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - aVar3);
    if (fVerbose != 0) {
      printf("Nontrivial classes:\n");
      Vec_WecPrint(vEquivs2,1);
    }
    if (_fBetterQual_local != (Vec_Ptr_t **)0x0) {
      *_fBetterQual_local = (Vec_Ptr_t *)0x0;
    }
    if (pvPiPerms_local != (Vec_Ptr_t **)0x0) {
      pVVar5 = Vec_WecConvertToVecPtr(vEquivs2);
      *pvPiPerms_local = pVVar5;
    }
    Vec_WecFree(vEquivs2);
    pGia_local = (Gia_Man_t *)vEquivs;
  }
  else {
    Vec_WecFree(vEquivs2);
    pGia_local = Gia_ManDup((Gia_Man_t *)pvPosEquivs_local);
  }
  return pGia_local;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce2( Gia_Man_t * pGia, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fBetterQual, int fDualOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pPart;
    Vec_Wec_t * vEquivs, * vEquivs2;
    Vec_Int_t * vRemains;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    vEquivs = Gia_Iso2ManPerform( pGia, fVeryVerbose );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_WecFree( vEquivs );
        return Gia_ManDup(pGia);
    }
    // verify classes
    if ( fBetterQual )
        vEquivs2 = Gia_Iso2ManCheckIsoClasses( pGia, vEquivs );
    else
        vEquivs2 = Gia_Iso2ManCheckIsoClassesSkip( pGia, vEquivs );
    Vec_WecFree( vEquivs );
    vEquivs = vEquivs2;
    // sort equiv classes by the first integer
    Vec_WecSortByFirstInt( vEquivs, 0 );
    // find the first outputs
    vRemains = Vec_WecCollectFirsts( vEquivs );
    // derive the final GIA
    pPart = Gia_ManDupCones( pGia, Vec_IntArray(vRemains), Vec_IntSize(vRemains), 0 );
    Vec_IntFree( vRemains );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vEquivs, 1 );
    }
    if ( pvPiPerms )
        *pvPiPerms = NULL;
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vEquivs );
    Vec_WecFree( vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}